

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O2

void fetchTransformedBilinear_slow_fetcher<(TextureBlendType)4,(QPixelLayout::BPP)6,unsigned_int>
               (uint *buf1,uint *buf2,ushort *distxs,ushort *distys,int len,QTextureData *image,
               qreal *fx,qreal *fy,qreal *fw,qreal fdx,qreal fdy,qreal fdw)

{
  double dVar1;
  uchar *puVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  double __x;
  double __x_00;
  
  puVar2 = image->imageData;
  lVar3 = image->bytesPerLine;
  uVar13 = 0;
  uVar12 = (ulong)(uint)len;
  if (len < 1) {
    uVar12 = uVar13;
  }
  for (; uVar12 != uVar13; uVar13 = uVar13 + 1) {
    uVar15 = -(ulong)(*fw == 0.0);
    dVar4 = (double)(uVar15 & 0x40d0000000000000 | ~uVar15 & (ulong)(1.0 / *fw));
    dVar1 = *fx;
    __x_00 = dVar4 * dVar1 + -0.5;
    __x = *fy * dVar4 + -0.5;
    dVar4 = floor(__x_00);
    iVar14 = (int)dVar4;
    dVar5 = floor(__x);
    iVar7 = (int)dVar5;
    distxs[uVar13] = (ushort)(int)((__x_00 - (double)(int)dVar4) * 65536.0);
    distys[uVar13] = (ushort)(int)((__x - (double)(int)dVar5) * 65536.0);
    iVar10 = image->x2 + -1;
    iVar6 = iVar14;
    if (iVar10 < iVar14) {
      iVar6 = iVar10;
    }
    iVar9 = iVar14 + 1;
    if (iVar10 <= iVar14) {
      iVar9 = iVar10;
    }
    iVar10 = image->x1;
    if (iVar14 < iVar10) {
      iVar9 = iVar10;
      iVar6 = iVar10;
    }
    iVar14 = image->y2 + -1;
    iVar10 = iVar7;
    if (iVar14 < iVar7) {
      iVar10 = iVar14;
    }
    iVar11 = iVar7 + 1;
    if (iVar14 <= iVar7) {
      iVar11 = iVar14;
    }
    iVar14 = image->y1;
    if (iVar7 < iVar14) {
      iVar11 = iVar14;
      iVar10 = iVar14;
    }
    lVar8 = iVar10 * lVar3;
    buf1[uVar13 * 2] = *(uint *)(puVar2 + (long)iVar6 * 4 + lVar8);
    buf1[uVar13 * 2 + 1] = *(uint *)(puVar2 + (long)iVar9 * 4 + lVar8);
    lVar8 = iVar11 * lVar3;
    buf2[uVar13 * 2] = *(uint *)(puVar2 + (long)iVar6 * 4 + lVar8);
    buf2[uVar13 * 2 + 1] = *(uint *)(puVar2 + (long)iVar9 * 4 + lVar8);
    *fx = dVar1 + fdx;
    *fy = *fy + fdy;
    *fw = *fw + fdw;
  }
  return;
}

Assistant:

static void QT_FASTCALL fetchTransformedBilinear_slow_fetcher(T *buf1, T *buf2, ushort *distxs, ushort *distys,
                                                              const int len, const QTextureData &image,
                                                              qreal &fx, qreal &fy, qreal &fw,
                                                              const qreal fdx, const qreal fdy, const qreal fdw)
{
    const QPixelLayout &layout = qPixelLayouts[image.format];
    constexpr bool useFetch = (bpp < QPixelLayout::BPP32);
    if (useFetch)
        Q_ASSERT(sizeof(T) == sizeof(uint));
    else
        Q_ASSERT(layout.bpp == bpp);

    const Fetch1PixelFunc fetch1 = (bpp == QPixelLayout::BPPNone) ? fetch1PixelTable[layout.bpp] : fetch1Pixel<bpp>;

    for (int i = 0; i < len; ++i) {
        const qreal iw = fw == 0 ? 16384 : 1 / fw;
        const qreal px = fx * iw - qreal(0.5);
        const qreal py = fy * iw - qreal(0.5);

        int x1 = qFloor(px);
        int x2;
        int y1 = qFloor(py);
        int y2;

        distxs[i] = ushort((px - x1) * (1<<16));
        distys[i] = ushort((py - y1) * (1<<16));

        fetchTransformedBilinear_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, x1, x2);
        fetchTransformedBilinear_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, y1, y2);

        const uchar *s1 = image.scanLine(y1);
        const uchar *s2 = image.scanLine(y2);
        if constexpr (useFetch) {
            buf1[i * 2 + 0] = fetch1(s1, x1);
            buf1[i * 2 + 1] = fetch1(s1, x2);
            buf2[i * 2 + 0] = fetch1(s2, x1);
            buf2[i * 2 + 1] = fetch1(s2, x2);
        } else {
            buf1[i * 2 + 0] = reinterpret_cast<const T *>(s1)[x1];
            buf1[i * 2 + 1] = reinterpret_cast<const T *>(s1)[x2];
            buf2[i * 2 + 0] = reinterpret_cast<const T *>(s2)[x1];
            buf2[i * 2 + 1] = reinterpret_cast<const T *>(s2)[x2];
        }

        fx += fdx;
        fy += fdy;
        fw += fdw;
    }
}